

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

CompilerReflection * __thiscall
spirv_cross::CompilerReflection::execution_model_to_str_abi_cxx11_
          (CompilerReflection *this,ExecutionModel model)

{
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  ExecutionModel local_14;
  CompilerReflection *pCStack_10;
  ExecutionModel model_local;
  
  local_14 = model;
  pCStack_10 = this;
  if (model == ExecutionModelVertex) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"vert",&local_15);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (model == ExecutionModelTessellationControl) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"tesc",local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (model == ExecutionModelTessellationEvaluation) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"tese",&local_26);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (model == ExecutionModelGeometry) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"geom",&local_27);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (model == ExecutionModelFragment) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"frag",&local_28);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (model == ExecutionModelGLCompute) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"comp",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if (model == ExecutionModelRayGenerationKHR) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"rgen",&local_2a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  else if (model == ExecutionModelIntersectionKHR) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"rint",&local_2b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  else if (model == ExecutionModelAnyHitKHR) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"rahit",&local_2c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  else if (model == ExecutionModelClosestHitKHR) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"rchit",&local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else if (model == ExecutionModelMissKHR) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"rmiss",&local_2e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (model == ExecutionModelCallableKHR) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"rcall",&local_2f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"???",&local_30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  return this;
}

Assistant:

string CompilerReflection::execution_model_to_str(spv::ExecutionModel model)
{
	switch (model)
	{
	case ExecutionModelVertex:
		return "vert";
	case ExecutionModelTessellationControl:
		return "tesc";
	case ExecutionModelTessellationEvaluation:
		return "tese";
	case ExecutionModelGeometry:
		return "geom";
	case ExecutionModelFragment:
		return "frag";
	case ExecutionModelGLCompute:
		return "comp";
	case ExecutionModelRayGenerationNV:
		return "rgen";
	case ExecutionModelIntersectionNV:
		return "rint";
	case ExecutionModelAnyHitNV:
		return "rahit";
	case ExecutionModelClosestHitNV:
		return "rchit";
	case ExecutionModelMissNV:
		return "rmiss";
	case ExecutionModelCallableNV:
		return "rcall";
	default:
		return "???";
	}
}